

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::count_max_rep
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
          vector<int,_std::allocator<int>_> *space,int i0,int sub_i0)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference piVar5;
  const_reference pvVar6;
  const_reference this_00;
  int *piVar7;
  int local_a0;
  int local_9c;
  int local_70;
  int local_6c;
  const_iterator cStack_68;
  int d;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int local_48;
  int local_44;
  int local_40;
  int dem;
  int i;
  allocator<int> local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  int sub_i0_local;
  int i0_local;
  vector<int,_std::allocator<int>_> *space_local;
  Arcflow *this_local;
  vector<int,_std::allocator<int>_> *r;
  
  local_29 = 0;
  iVar1 = (this->inst).nsizes;
  local_28 = sub_i0;
  local_24 = i0;
  _sub_i0_local = space;
  space_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (Arcflow *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_2a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)iVar1,&local_2a);
  std::allocator<int>::~allocator(&local_2a);
  local_40 = local_24;
  do {
    if ((this->inst).nsizes <= local_40) {
      return __return_storage_ptr__;
    }
    if (((this->inst).binary & 1U) == 0) {
      pvVar4 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->sitems,(long)local_40);
      local_9c = pvVar4->demand;
    }
    else {
      local_9c = 1;
    }
    local_44 = local_9c;
    if (local_40 == local_24) {
      local_48 = 0;
      __range2._4_4_ = local_9c - local_28;
      piVar7 = std::max<int>(&local_48,(int *)((long)&__range2 + 4));
      local_a0 = *piVar7;
    }
    else {
      local_a0 = local_9c;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_40);
    *pvVar3 = local_a0;
    pvVar4 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->sitems,(long)local_40);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar4->nonzero);
    cStack_68 = std::vector<int,_std::allocator<int>_>::end(&pvVar4->nonzero);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff98), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_6c = *piVar5;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)local_40);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](_sub_i0_local,(long)local_6c);
      iVar1 = *pvVar6;
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->weights,(long)local_40);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_6c);
      local_70 = iVar1 / *pvVar6;
      piVar7 = std::min<int>(pvVar3,&local_70);
      iVar1 = *piVar7;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)local_40);
      *pvVar3 = iVar1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)local_40);
      if (*pvVar3 == 0) break;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

std::vector<int> Arcflow::count_max_rep(const std::vector<int> &space, int i0 = 0,
										int sub_i0 = 0) const {
	std::vector<int> r(inst.nsizes);
	for (int i = i0; i < inst.nsizes; i++) {
		int dem = inst.binary ? 1 : sitems[i].demand;
		r[i] = i != i0 ? dem : std::max(0, dem - sub_i0);
		for (int d : sitems[i].nonzero) {
			r[i] = std::min(r[i], space[d] / weights[i][d]);
			if (!r[i]) {
				break;
			}
		}
	}
	return r;
}